

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::OwnFd> __thiscall kj::AsyncCapabilityStream::receiveFd(AsyncCapabilityStream *this)

{
  PromiseArena *pPVar1;
  AsyncInputStream AVar2;
  AsyncOutputStream node;
  void *pvVar3;
  TransformPromiseNodeBase *this_00;
  AsyncCapabilityStream local_48;
  SourceLocation local_38;
  
  tryReceiveFd(&local_48);
  AVar2._vptr_AsyncInputStream =
       local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)
           local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_48,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2630:30)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_006e0dc8;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] = (_func_int *)0x0
    ;
    this_00 = (TransformPromiseNodeBase *)
              (local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_48,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2630:30)>
               ::anon_class_1_0_00000001_for_func::operator());
    AVar2._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_006e0dc8;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  local_38.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_38.function = "then";
  local_38.lineNumber = 0x58b;
  local_38.columnNumber = 0x4c;
  local_48.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)this_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)this,
             (OwnPromiseNode *)&local_48.super_AsyncIoStream.super_AsyncOutputStream,&local_38);
  node._vptr_AsyncOutputStream =
       local_48.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  if ((TransformPromiseNodeBase *)
      local_48.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream !=
      (TransformPromiseNodeBase *)0x0) {
    local_48.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream = (_func_int **)0x0
    ;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_AsyncOutputStream);
  }
  AVar2._vptr_AsyncInputStream =
       local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  if ((PromiseArenaMember *)
      local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (PromiseArenaMember *)0x0) {
    local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<OwnFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<OwnFd>&& result) -> Promise<OwnFd> {
    KJ_IF_SOME(r, result) {
      return kj::mv(r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}